

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_trade_api.h
# Opt level: O1

CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_> * __thiscall
tquant::api::impl::MpRpcTradeApiImpl::query_trades
          (CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_>
           *__return_storage_ptr__,MpRpcTradeApiImpl *this,string *account_id,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *codes)

{
  string local_38;
  
  if (codes == (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  }
  else {
    union_str(&local_38,codes,',');
  }
  (*(this->super_TradeApi)._vptr_TradeApi[7])(__return_storage_ptr__,this,account_id,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual CallResult<const vector<Trade>> query_trades(const string& account_id, const unordered_set<string>* codes = nullptr) override
        {
            return query_trades(account_id, codes ? union_str(*codes) : "");
        }